

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O2

uint32_t vkb::detail::get_present_queue_index
                   (VkPhysicalDevice phys_device,VkSurfaceKHR surface,
                   vector<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                   *families)

{
  int iVar1;
  ulong in_RAX;
  uint32_t i;
  uint uVar2;
  ulong uStack_38;
  VkBool32 presentSupport;
  
  uVar2 = 0;
  uStack_38 = in_RAX;
  do {
    if ((uint)(((long)(families->
                      super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                      )._M_impl.super__Vector_impl_data._M_finish -
               (long)(families->
                     super__Vector_base<VkQueueFamilyProperties,_std::allocator<VkQueueFamilyProperties>_>
                     )._M_impl.super__Vector_impl_data._M_start) / 0x18) <= uVar2) {
      return 0xffffffff;
    }
    uStack_38 = uStack_38 & 0xffffffff;
    if (surface != (VkSurfaceKHR)0x0) {
      iVar1 = (*(code *)vulkan_functions()::v._208_8_)(phys_device,uVar2,surface,&presentSupport);
      if (iVar1 != 0) {
        return 0xffffffff;
      }
      if (presentSupport == 1) {
        return uVar2;
      }
    }
    uVar2 = uVar2 + 1;
  } while( true );
}

Assistant:

uint32_t get_present_queue_index(
    VkPhysicalDevice const phys_device, VkSurfaceKHR const surface, std::vector<VkQueueFamilyProperties> const& families) {
    for (uint32_t i = 0; i < static_cast<uint32_t>(families.size()); i++) {
        VkBool32 presentSupport = VK_FALSE;
        if (surface != VK_NULL_HANDLE) {
            VkResult res = detail::vulkan_functions().fp_vkGetPhysicalDeviceSurfaceSupportKHR(phys_device, i, surface, &presentSupport);
            if (res != VK_SUCCESS) return QUEUE_INDEX_MAX_VALUE; // TODO: determine if this should fail another way
        }
        if (presentSupport == VK_TRUE) return i;
    }
    return QUEUE_INDEX_MAX_VALUE;
}